

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O1

void test_nested(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint __fd;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *__buf;
  char *__n;
  void *pvVar7;
  void *__s2;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  DIR *__dirp;
  dirent *pdVar12;
  FILE *__stream;
  long lVar13;
  undefined8 uVar14;
  uint extraout_EDX;
  ulong uVar15;
  char *__dest;
  char *pcVar16;
  ulong uVar17;
  DIR *__s;
  DIR *__name;
  char *pcVar18;
  DIR *pDVar19;
  DIR *__filename;
  undefined8 uVar20;
  DIR *pDVar21;
  char *pcVar22;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined1 auStack_6e18 [8];
  undefined1 auStack_6e10 [504];
  ulong uStack_6c18;
  DIR *pDStack_6c10;
  char *pcStack_6c08;
  DIR *pDStack_6c00;
  DIR *pDStack_6bf8;
  int iStack_6bec;
  DIR *pDStack_6be8;
  stat sStack_6be0;
  char acStack_6b50 [512];
  size_t sStack_6950;
  char *pcStack_6948;
  DIR *pDStack_6940;
  char *pcStack_6938;
  code *pcStack_6930;
  char *pcStack_6928;
  ulong uStack_6920;
  char *pcStack_6918;
  DIR *pDStack_6910;
  undefined8 *puStack_6908;
  undefined8 uStack_68d0;
  undefined1 *puStack_68c8;
  undefined1 *puStack_68c0;
  undefined1 auStack_68b0 [8];
  char *pcStack_68a8;
  undefined8 uStack_6898;
  char *pcStack_6890;
  undefined8 uStack_6888;
  undefined8 uStack_6870;
  DIR aDStack_6800 [25944];
  char *pcStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  code *apcStack_288 [2];
  undefined1 auStack_278 [116];
  uint uStack_204;
  char acStack_200 [312];
  undefined8 uStack_c8;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *pcStack_a8;
  char *pcStack_a0;
  char *pcStack_98;
  undefined8 uStack_90;
  code *pcStack_88;
  char *pcStack_80;
  undefined8 uStack_78;
  char *pcStack_70;
  int *piStack_68;
  char *pcStack_60;
  char *pcStack_58;
  code *pcStack_50;
  int i32;
  char *utf8;
  
  pcStack_50 = (code *)0x13c6a8;
  uStack_78 = bson_bcon_magic();
  pcStack_58 = (char *)0x0;
  pcStack_60 = "}";
  piStack_68 = (int *)0xa;
  pcStack_70 = (char *)0xf;
  pcStack_80 = (char *)0x13c6fd;
  uVar5 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_50 = (code *)0x13c709;
  uStack_78 = bson_bcone_magic();
  piStack_68 = &i32;
  pcStack_58 = (char *)0x0;
  pcStack_60 = "}";
  pcStack_70 = (char *)0xf;
  pcStack_80 = "bar";
  pcStack_88 = (code *)0x13f9a8;
  uStack_90 = 0x13c745;
  cVar1 = bcon_extract(uVar5,"hello",uStack_78,0,&utf8,"foo");
  if (cVar1 == '\0') {
    pcStack_50 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_50 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_50 = (code *)0x13c75e;
    iVar2 = strcmp("world",utf8);
    if (iVar2 != 0) goto LAB_0013c785;
    if (i32 == 10) {
      pcStack_50 = (code *)0x13c771;
      bson_destroy(uVar5);
      return;
    }
  }
  pcStack_50 = test_skip;
  test_nested_cold_3();
  pcStack_50 = (code *)0x148ce7;
  pcStack_58 = "bar";
  pcStack_60 = (char *)0x0;
  piStack_68 = (int *)0x14c89e;
  pcStack_70 = "foo";
  pcStack_88 = (code *)0x13c79f;
  uStack_78 = uVar5;
  pcStack_b0 = (char *)bson_bcon_magic();
  uStack_90 = 0;
  pcStack_98 = "}";
  pcStack_a0 = (char *)0xa;
  pcStack_a8 = (char *)0xf;
  pcStack_b8 = (char *)0x13c7f2;
  uVar5 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_88 = (code *)0x13c7fe;
  pcVar6 = (char *)bson_bcone_magic();
  pcVar22 = "}";
  uStack_90 = 0;
  pcStack_98 = "}";
  pcStack_a0 = (char *)0x10;
  pcStack_a8 = (char *)0x1c;
  pcStack_b8 = "bar";
  pcStack_c0 = "{";
  uStack_c8 = 0x13c83a;
  pcStack_b0 = pcVar6;
  cVar1 = bcon_extract(uVar5,"hello",pcVar6,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_88 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_90 = 0;
    pcStack_98 = "}";
    pcStack_a0 = (char *)0x12;
    pcStack_a8 = (char *)0x1c;
    pcStack_b8 = "bar";
    pcStack_c0 = "{";
    uStack_c8 = 0x13c879;
    pcStack_b0 = pcVar6;
    cVar1 = bcon_extract(uVar5,"hello",pcVar6,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar5);
      return;
    }
  }
  pcStack_88 = test_iter;
  test_skip_cold_2();
  pcStack_88 = (code *)0x14c89e;
  pcStack_98 = "bar";
  pcStack_a0 = "}";
  pcStack_b0 = "{";
  apcStack_288[0] = (code *)0x13c8be;
  pcStack_a8 = pcVar6;
  uStack_90 = uVar5;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_288[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_288[0] = (code *)0x13c8ed;
  uVar5 = bson_bcone_magic();
  pcVar8 = acStack_200;
  pcVar16 = "foo";
  uVar14 = 0x1d;
  uVar20 = 0;
  apcStack_288[0] = (code *)0x13c90d;
  pcVar18 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar5);
  uVar5 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_288[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_288[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_288[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_288[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_288[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar18 = acStack_200;
    apcStack_288[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar5 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar18 = acStack_200;
    apcStack_288[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar5 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar20 = 0;
    apcStack_288[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_200);
    apcStack_288[0] = (code *)0x13c96f;
    pcVar6 = (char *)bson_get_data(__n_00);
    apcStack_288[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_288[0] = (code *)0x13c98e;
      pvVar7 = (void *)bson_get_data(__n);
      apcStack_288[0] = (code *)0x13c999;
      __s2 = (void *)bson_get_data(__n_00);
      apcStack_288[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar7,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_288[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_288[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_288[0] = (code *)0x13c9d4;
    uVar14 = bson_as_canonical_extended_json(__n_00);
    apcStack_288[0] = (code *)0x13c9e1;
    pcVar8 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar15 = 0xffffffff;
    if (uVar3 != 0) {
      uVar17 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar17) break;
        if (pcVar6[uVar17] != __buf[uVar17]) {
          uVar15 = uVar17 & 0xffffffff;
          break;
        }
        uVar17 = uVar17 + 1;
      } while (uVar3 != (uint)uVar17);
    }
    if ((int)uVar15 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar15 = (ulong)(uVar3 - 1);
    }
    apcStack_288[0] = (code *)0x13ca3c;
    uVar5 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar15);
    apcStack_288[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar22 = (char *)(ulong)uVar3;
    pcVar18 = "failure.expected.bson";
    pcVar16 = (char *)0x42;
    apcStack_288[0] = (code *)0x13ca6f;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    uStack_204 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (__fd == 0xffffffff) goto LAB_0013cad0;
    pcVar22 = (char *)(ulong)__fd;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar18 = (char *)(ulong)uVar3;
    apcStack_288[0] = (code *)0x13ca95;
    pcVar16 = pcVar6;
    pcVar9 = (char *)write(uVar3,pcVar6,(size_t)__n_00);
    if (pcVar9 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_288[0] = (code *)0x13caab;
      pcVar16 = __buf;
      pcVar18 = pcVar22;
      pcVar9 = (char *)write(__fd,__buf,(size_t)__n);
      if (pcVar9 != __n) goto LAB_0013cada;
      pcVar18 = (char *)(ulong)uStack_204;
      pcVar16 = (char *)(ulong)__fd;
      apcStack_288[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_288[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_288[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_68c0 = auStack_68b0;
  if (extraout_AL != '\0') {
    uStack_6870 = uVar5;
  }
  puStack_6908 = (undefined8 *)0x13cb62;
  pcStack_68a8 = pcVar16;
  uStack_6898 = uVar14;
  pcStack_6890 = pcVar8;
  uStack_6888 = uVar20;
  pcStack_2a8 = __n;
  pcStack_2a0 = pcVar6;
  pcStack_298 = __buf;
  pcStack_290 = __n_00;
  apcStack_288[0] = (code *)&pcStack_88;
  bcon_extract_ctx_init(aDStack_6800);
  puStack_68c8 = auStack_278;
  uStack_68d0 = 0x3000000010;
  uVar5 = 0x10;
  if (0 < (int)(uint)pcStack_68a8) {
    uVar3 = (uint)pcStack_68a8;
    do {
      puStack_6908 = (undefined8 *)0x13cbce;
      __s = aDStack_6800;
      pcVar6 = pcVar18;
      cVar1 = bcon_extract_ctx_va(pcVar18,aDStack_6800,&uStack_68d0);
      iVar2 = (int)uVar5;
      if (cVar1 == '\0') {
        puStack_6908 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_6930 = (code *)0x13cc03;
        __name = __s;
        pcStack_6928 = pcVar18;
        uStack_6920 = (ulong)uVar3;
        pcStack_6918 = pcVar22;
        pDStack_6910 = aDStack_6800;
        puStack_6908 = &uStack_68d0;
        pcVar22 = (char *)strlen(pcVar6);
        pcStack_6930 = (code *)0x13cc0e;
        pDVar19 = __s;
        sVar10 = strlen((char *)__s);
        if ((int)sVar10 + (int)pcVar22 < 499) {
          pcStack_6930 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_6930 = (code *)0x13cc38;
          strncat(__dest,pcVar6,(long)(int)pcVar22);
          pcStack_6930 = (code *)0x13cc40;
          sVar11 = strlen(__dest);
          (__dest + sVar11)[0] = '/';
          (__dest + sVar11)[1] = '\0';
          pcStack_6930 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar10);
          pcVar6 = __dest;
          do {
            if (*pcVar6 == '\\') {
              *pcVar6 = '/';
            }
            else if (*pcVar6 == '\0') {
              return;
            }
            pcVar6 = pcVar6 + 1;
          } while( true );
        }
        pcStack_6930 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar15 = (ulong)extraout_EDX;
        pDStack_6bf8 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_6bec = iVar2;
        sStack_6950 = sVar10;
        pcStack_6948 = pcVar22;
        pDStack_6940 = __s;
        pcStack_6938 = pcVar6;
        pcStack_6930 = (code *)apcStack_288;
        __dirp = opendir((char *)__name);
        pDVar21 = pDVar19;
        pDStack_6c00 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_6bf8 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar12 = readdir(__dirp);
        if (pdVar12 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar22 = "..";
        pDVar21 = (DIR *)0x147699;
        pDStack_6be8 = pDVar19;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_6bf8 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar6,acStack_6b50);
  pDStack_6bf8 = (DIR *)0x13cd32;
  iVar4 = stat(pcVar6,&sStack_6be0);
  if ((iVar4 == 0) && ((sStack_6be0.st_mode & 0xf000) == 0x4000)) {
    pDStack_6bf8 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_6be8,acStack_6b50,iVar2,iStack_6bec);
    uVar15 = (ulong)uVar3;
  }
  else {
    pDStack_6bf8 = (DIR *)0x13cd73;
    pcVar8 = strstr(pcVar6,".json");
    if (pcVar8 != (char *)0x0) {
      uVar15 = (ulong)(iVar2 + 1);
      pDStack_6bf8 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar6,(char *)(pDStack_6be8 + (long)iVar2 * 500));
    }
  }
  pDStack_6bf8 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar12 = readdir(__dirp);
  if (pdVar12 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_6bf8 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar15;
  if (iVar2 < iStack_6bec) {
    do {
      pcVar6 = pdVar12->d_name;
      pDStack_6bf8 = (DIR *)0x13ccea;
      iVar4 = strcmp(pcVar6,"..");
      if (iVar4 != 0) {
        pDStack_6bf8 = (DIR *)0x13ccf9;
        iVar4 = strcmp(pcVar6,".");
        if (iVar4 != 0) goto LAB_0013cd12;
      }
      pDStack_6bf8 = (DIR *)0x13cd05;
      pdVar12 = readdir(__dirp);
      if (pdVar12 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_6bf8 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_6c00 = __dirp;
LAB_0013cdc9:
  pDStack_6bf8 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_6c18 = uVar15;
  pDStack_6c10 = pDVar21;
  pcStack_6c08 = pcVar22;
  pDStack_6bf8 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar10 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar10) {
      pvVar7 = (void *)bson_malloc0(sVar10);
      sVar11 = fread(pvVar7,1,sVar10,__stream);
      if (sVar11 != sVar10) {
        abort();
      }
      fclose(__stream);
      if (pvVar7 != (void *)0x0) {
        lVar13 = bson_new_from_json(pvVar7,sVar10,auStack_6e18);
        if (lVar13 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_6e10);
          abort();
        }
        bson_free(pvVar7);
      }
    }
  }
  return;
}

Assistant:

static void
test_nested (void)
{
   const char *utf8;
   int i32;

   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_UTF8 (utf8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_INT32 (i32),
                         "}"));

   BSON_ASSERT (strcmp ("world", utf8) == 0);
   BSON_ASSERT (i32 == 10);

   bson_destroy (bcon);
}